

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fs_read_bufs(int add_flags)

{
  int iVar1;
  uv_buf_t uVar2;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 local_358 [8];
  uv_buf_t bufs [4];
  char scratch [768];
  int add_flags_local;
  
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",add_flags,0,
                     (uv_fs_cb)0x0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb4c,
            "0 <= uv_fs_open(NULL, &open_req1, \"test/fixtures/lorem_ipsum.txt\", O_RDONLY | add_flags, 0, NULL)"
           );
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb4d,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                     (uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb51,"UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result, NULL, 0, 0, NULL)");
    abort();
  }
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                     (uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb53,"UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result, NULL, 1, 0, NULL)");
    abort();
  }
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)local_358,0,0,
                     (uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb55,"UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result, bufs, 0, 0, NULL)");
    abort();
  }
  uVar2 = uv_buf_init((char *)&bufs[3].len,0x100);
  local_368 = uVar2.base;
  local_358 = (undefined1  [8])local_368;
  local_360 = (char *)uVar2.len;
  bufs[0].base = local_360;
  uVar2 = uv_buf_init(scratch + 0xf8,0x100);
  local_378 = uVar2.base;
  bufs[0].len = (size_t)local_378;
  local_370 = (char *)uVar2.len;
  bufs[1].base = local_370;
  uVar2 = uv_buf_init(scratch + 0x1f8,0x80);
  local_388 = uVar2.base;
  bufs[1].len = (size_t)local_388;
  local_380 = (char *)uVar2.len;
  bufs[2].base = local_380;
  uVar2 = uv_buf_init(scratch + 0x278,0x80);
  local_398 = uVar2.base;
  bufs[2].len = (size_t)local_398;
  local_390 = (char *)uVar2.len;
  bufs[3].base = local_390;
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)local_358,2,0,
                     (uv_fs_cb)0x0);
  if (iVar1 != 0x1be) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb62,"446 == uv_fs_read(NULL, &read_req, open_req1.result, bufs + 0, 2, 0, NULL)");
    abort();
  }
  if (read_req.result != 0x1be) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb63,"read_req.result == 446");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)&bufs[1].len,2
                     ,0x100,(uv_fs_cb)0x0);
  if (iVar1 != 0xbe) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb6c,"190 == uv_fs_read(NULL, &read_req, open_req1.result, bufs + 2, 2, 256, NULL)");
    abort();
  }
  if (read_req.result != 0xbe) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb6d,"read_req.result == 190");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  iVar1 = memcmp((void *)bufs[0].len,(void *)bufs[1].len,0x80);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb70,"0 == memcmp(bufs[1].base + 0, bufs[2].base, 128)");
    abort();
  }
  iVar1 = memcmp((void *)(bufs[0].len + 0x80),(void *)bufs[2].len,0x3e);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb71,"0 == memcmp(bufs[1].base + 128, bufs[3].base, 190 - 128)");
    abort();
  }
  iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb73,"0 == uv_fs_close(NULL, &close_req, open_req1.result, NULL)");
    abort();
  }
  if (close_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xb74,"close_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  return;
}

Assistant:

static void fs_read_bufs(int add_flags) {
  char scratch[768];
  uv_buf_t bufs[4];

  ASSERT(0 <= uv_fs_open(NULL, &open_req1,
                         "test/fixtures/lorem_ipsum.txt",
                         O_RDONLY | add_flags, 0, NULL));
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 0, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 1, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 bufs, 0, 0, NULL));

  bufs[0] = uv_buf_init(scratch + 0, 256);
  bufs[1] = uv_buf_init(scratch + 256, 256);
  bufs[2] = uv_buf_init(scratch + 512, 128);
  bufs[3] = uv_buf_init(scratch + 640, 128);

  ASSERT(446 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 0,
                           2,  /* 2x 256 bytes. */
                           0,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == 446);
  uv_fs_req_cleanup(&read_req);

  ASSERT(190 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 2,
                           2,  /* 2x 128 bytes. */
                           256,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == /* 446 - 256 */ 190);
  uv_fs_req_cleanup(&read_req);

  ASSERT(0 == memcmp(bufs[1].base + 0, bufs[2].base, 128));
  ASSERT(0 == memcmp(bufs[1].base + 128, bufs[3].base, 190 - 128));

  ASSERT(0 == uv_fs_close(NULL, &close_req, open_req1.result, NULL));
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);
}